

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O0

libcaption_stauts_t caption_frame_decode_midrowchange(caption_frame_t *frame,uint16_t cc_data)

{
  int iVar1;
  uint16_t in_SI;
  long in_RDI;
  int unl;
  int chn;
  eia608_style_t sty;
  byte local_18 [4];
  int local_14;
  undefined1 local_10 [8];
  long local_8;
  
  local_8 = in_RDI;
  iVar1 = eia608_parse_midrowchange(in_SI,&local_14,(eia608_style_t *)local_10,(int *)local_18);
  if (iVar1 != 0) {
    *(byte *)(local_8 + 0x38) =
         *(byte *)(local_8 + 0x38) & 0xf1 | (local_10[0] & eia608_style_italics) << 1;
    *(byte *)(local_8 + 0x38) = *(byte *)(local_8 + 0x38) & 0xfe | local_18[0] & 1;
  }
  return LIBCAPTION_OK;
}

Assistant:

libcaption_stauts_t caption_frame_decode_midrowchange(caption_frame_t* frame, uint16_t cc_data)
{
    eia608_style_t sty;
    int chn, unl;

    if (eia608_parse_midrowchange(cc_data, &chn, &sty, &unl)) {
        frame->state.sty = sty;
        frame->state.uln = unl;
    }

    return LIBCAPTION_OK;
}